

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O3

ecs_data_t *
ecs_table_merge(ecs_world_t *world,ecs_table_t *new_table,ecs_table_t *old_table,
               ecs_data_t *new_data,ecs_data_t *old_data)

{
  int iVar1;
  ulong uVar2;
  ecs_vector_t *peVar3;
  ecs_c_info_t *peVar4;
  ecs_column_t *peVar5;
  ecs_vector_t *peVar6;
  ecs_move_t p_Var7;
  ecs_entity_t eVar8;
  int *piVar9;
  ecs_sw_column_t *peVar10;
  short sVar11;
  uint count;
  int32_t new_index;
  int32_t iVar12;
  int32_t count_00;
  void *pvVar13;
  void *pvVar14;
  undefined8 *puVar15;
  ecs_entity_t *entities;
  size_t sVar16;
  int16_t iVar17;
  int iVar18;
  char *pcVar19;
  int16_t extraout_DX;
  int16_t extraout_DX_00;
  int16_t size;
  int16_t size_00;
  int iVar20;
  ecs_column_t *column;
  ecs_column_t *peVar21;
  int iVar22;
  ecs_column_t *peVar23;
  long lVar24;
  ulong uVar25;
  ecs_column_t *peVar26;
  int elem_count;
  int iVar27;
  long lVar28;
  bool bVar29;
  ecs_vector_t *local_58;
  int local_4c;
  ecs_entity_t *local_48;
  void *local_40;
  void *local_38;
  
  pcVar19 = "old_table != NULL";
  _ecs_assert(old_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"old_table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x7b0);
  if (old_table == (ecs_table_t *)0x0) {
    __assert_fail("old_table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x7b0,
                  "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                 );
  }
  if (new_table == (ecs_table_t *)0x0) {
    ecs_table_clear_data(world,old_table,old_data);
  }
  else if (old_data != (ecs_data_t *)0x0) {
    bVar29 = new_data == (ecs_data_t *)0x0;
    if (bVar29) {
      new_data = get_data_intern(new_table,true);
    }
    pvVar13 = _ecs_vector_first(old_data->entities,8,0x10);
    count = ecs_vector_count(old_data->entities);
    new_index = ecs_vector_count(new_data->entities);
    pvVar14 = _ecs_vector_first(old_data->record_ptrs,8,0x10);
    iVar17 = (int16_t)pcVar19;
    if (0 < (int)count) {
      uVar25 = 0;
      do {
        if (new_table == old_table) {
          puVar15 = (undefined8 *)
                    _ecs_sparse_get_or_create
                              ((world->store).entity_index,0x10,
                               *(uint64_t *)((long)pvVar13 + uVar25 * 8));
        }
        else {
          puVar15 = *(undefined8 **)((long)pvVar14 + uVar25 * 8);
          pcVar19 = "record != NULL";
          _ecs_assert(puVar15 != (undefined8 *)0x0,0xc,(char *)0x0,"record != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table.c"
                      ,0x7d3);
          if (puVar15 == (undefined8 *)0x0) {
            __assert_fail("record != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table.c"
                          ,0x7d3,
                          "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                         );
          }
        }
        iVar12 = ecs_row_to_record(new_index + (int)uVar25,
                                   SUB41((uint)*(undefined4 *)(puVar15 + 1) >> 0x1f,0));
        iVar17 = (int16_t)pcVar19;
        *(int32_t *)(puVar15 + 1) = iVar12;
        *puVar15 = new_table;
        uVar25 = uVar25 + 1;
      } while (count != uVar25);
    }
    if (bVar29 && new_table == old_table) {
      new_data->bs_columns = old_data->bs_columns;
      peVar3 = old_data->entities;
      peVar6 = old_data->record_ptrs;
      peVar10 = old_data->sw_columns;
      new_data->columns = old_data->columns;
      new_data->sw_columns = peVar10;
      new_data->entities = peVar3;
      new_data->record_ptrs = peVar6;
    }
    else {
      iVar22 = new_table->column_count;
      iVar1 = old_table->column_count;
      local_38 = _ecs_vector_first(new_table->type,8,0x10);
      local_40 = _ecs_vector_first(old_table->type,8,0x10);
      peVar26 = old_data->columns;
      peVar23 = new_data->columns;
      size = extraout_DX;
      if (peVar23 == (ecs_column_t *)0x0) {
        if (new_data->entities == (ecs_vector_t *)0x0) {
          ecs_init_data(world,new_table,new_data);
          peVar23 = new_data->columns;
          size = extraout_DX_00;
        }
        else {
          peVar23 = (ecs_column_t *)0x0;
        }
      }
      if (count == 0) {
        new_table->alloc_count = new_table->alloc_count + 1;
        return new_data;
      }
      merge_vector(&new_data->entities,old_data->entities,size,iVar17);
      old_data->entities = (ecs_vector_t *)0x0;
      entities = (ecs_entity_t *)_ecs_vector_first(new_data->entities,8,0x10);
      iVar12 = ecs_vector_count(new_data->entities);
      elem_count = count + new_index;
      iVar17 = 0x216c;
      _ecs_assert(iVar12 == elem_count,0xc,(char *)0x0,
                  "ecs_vector_count(new_data->entities) == old_count + new_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x725);
      iVar12 = ecs_vector_count(new_data->entities);
      if (iVar12 != elem_count) {
        __assert_fail("ecs_vector_count(new_data->entities) == old_count + new_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/table.c"
                      ,0x725,
                      "void merge_table_data(ecs_world_t *, ecs_table_t *, ecs_table_t *, int32_t, int32_t, ecs_data_t *, ecs_data_t *)"
                     );
      }
      merge_vector(&new_data->record_ptrs,old_data->record_ptrs,size_00,iVar17);
      old_data->record_ptrs = (ecs_vector_t *)0x0;
      iVar18 = 0;
      iVar20 = 0;
      if (0 < iVar1 && 0 < iVar22) {
        iVar18 = 0;
        iVar20 = 0;
        while( true ) {
          lVar24 = (long)iVar18;
          uVar25 = *(ulong *)((long)local_38 + lVar24 * 8);
          if (0xffffffffffffff < uVar25) break;
          lVar28 = (long)iVar20;
          uVar2 = *(ulong *)((long)local_40 + lVar28 * 8);
          if (0xffffffffffffff < uVar2) break;
          if (uVar25 == uVar2) {
            peVar3 = peVar26[lVar28].data;
            local_4c = iVar18;
            local_48 = (ecs_entity_t *)_ecs_vector_first(new_data->entities,8,0x10);
            peVar4 = new_table->c_info[lVar24];
            peVar5 = new_data->columns;
            peVar21 = peVar5 + lVar24;
            peVar6 = peVar5[lVar24].data;
            iVar18 = (int)peVar5[lVar24].size;
            sVar11 = peVar5[lVar24].alignment;
            local_58 = peVar6;
            iVar12 = ecs_vector_count(peVar6);
            if (iVar12 == 0) {
              if (peVar6 != (ecs_vector_t *)0x0) {
                ecs_vector_free(peVar6);
              }
              peVar21->data = peVar3;
            }
            else {
              count_00 = ecs_vector_count(peVar3);
              iVar17 = 0x10;
              if (0x10 < sVar11) {
                iVar17 = sVar11;
              }
              _ecs_vector_set_count(&local_58,iVar18,iVar17,count_00 + iVar12);
              peVar21->data = local_58;
              if (peVar4 != (ecs_c_info_t *)0x0) {
                ctor_component(world,peVar4,peVar21,local_48,iVar12,count_00);
              }
              pvVar13 = _ecs_vector_first(local_58,iVar18,iVar17);
              pvVar14 = _ecs_vector_first(peVar3,iVar18,iVar17);
              pvVar13 = (void *)((long)(iVar12 * iVar18) + (long)pvVar13);
              if ((peVar4 == (ecs_c_info_t *)0x0) ||
                 (p_Var7 = (peVar4->lifecycle).move, p_Var7 == (ecs_move_t)0x0)) {
                memcpy(pvVar13,pvVar14,(long)(count_00 * iVar18));
              }
              else {
                eVar8 = peVar4->component;
                sVar16 = ecs_to_size_t((long)iVar18);
                (*p_Var7)(world,eVar8,local_48,local_48,pvVar13,pvVar14,sVar16,count_00,
                          (peVar4->lifecycle).ctx);
              }
              ecs_vector_free(peVar3);
            }
            peVar26[lVar28].data = (ecs_vector_t *)0x0;
            iVar18 = local_4c + 1;
            if (new_table->dirty_state != (int32_t *)0x0) {
              piVar9 = new_table->dirty_state + iVar18;
              *piVar9 = *piVar9 + 1;
            }
            iVar20 = iVar20 + 1;
          }
          else {
            sVar11 = peVar23[lVar24].size;
            if (uVar25 < uVar2) {
              if (sVar11 != 0) {
                iVar17 = 0x10;
                if (0x10 < peVar23[lVar24].alignment) {
                  iVar17 = peVar23[lVar24].alignment;
                }
                _ecs_vector_set_count(&peVar23[lVar24].data,(int)sVar11,iVar17,elem_count);
                peVar4 = new_table->c_info[lVar24];
                if ((peVar4 != (ecs_c_info_t *)0x0) && ((peVar4->lifecycle).ctor != (ecs_xtor_t)0x0)
                   ) {
                  ctor_component(world,peVar4,peVar23 + lVar24,entities,0,elem_count);
                }
              }
              iVar18 = iVar18 + 1;
            }
            else if ((uVar2 < uVar25) && (sVar11 != 0)) {
              peVar21 = peVar26 + lVar28;
              peVar4 = old_table->c_info[lVar28];
              if ((peVar4 != (ecs_c_info_t *)0x0) && ((peVar4->lifecycle).dtor != (ecs_xtor_t)0x0))
              {
                dtor_component(world,peVar4,peVar21,entities,0,count);
              }
              ecs_vector_free(peVar21->data);
              peVar21->data = (ecs_vector_t *)0x0;
              iVar20 = iVar20 + 1;
            }
          }
          if ((iVar22 <= iVar18) || (iVar1 <= iVar20)) break;
        }
      }
      move_switch_columns(new_table,new_data,new_index,old_table,old_data,0,count);
      iVar27 = iVar22 - iVar18;
      if (iVar27 != 0 && iVar18 <= iVar22) {
        lVar24 = (long)iVar18;
        peVar23 = peVar23 + lVar24;
        do {
          if (peVar23->size != 0) {
            sVar11 = peVar23->alignment;
            if (peVar23->alignment < 0x11) {
              sVar11 = 0x10;
            }
            _ecs_vector_set_count(&peVar23->data,(int)peVar23->size,sVar11,elem_count);
            peVar4 = new_table->c_info[lVar24];
            if ((peVar4 != (ecs_c_info_t *)0x0) && ((peVar4->lifecycle).ctor != (ecs_xtor_t)0x0)) {
              ctor_component(world,peVar4,peVar23,entities,0,elem_count);
            }
          }
          lVar24 = lVar24 + 1;
          peVar23 = peVar23 + 1;
          iVar27 = iVar27 + -1;
        } while (iVar27 != 0);
      }
      iVar22 = iVar1 - iVar20;
      if (iVar22 != 0 && iVar20 <= iVar1) {
        lVar24 = (long)iVar20;
        peVar26 = peVar26 + lVar24;
        do {
          peVar4 = old_table->c_info[lVar24];
          if ((peVar4 != (ecs_c_info_t *)0x0) && ((peVar4->lifecycle).dtor != (ecs_xtor_t)0x0)) {
            dtor_component(world,peVar4,peVar26,entities,0,count);
          }
          ecs_vector_free(peVar26->data);
          peVar26->data = (ecs_vector_t *)0x0;
          lVar24 = lVar24 + 1;
          peVar26 = peVar26 + 1;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      piVar9 = new_table->dirty_state;
      if (piVar9 != (int *)0x0) {
        *piVar9 = *piVar9 + 1;
      }
    }
    new_table->alloc_count = new_table->alloc_count + 1;
    if (count == 0 || new_index != 0) {
      return new_data;
    }
    ecs_table_activate(world,new_table,(ecs_query_t *)0x0,true);
    return new_data;
  }
  return (ecs_data_t *)0x0;
}

Assistant:

ecs_data_t* ecs_table_merge(
    ecs_world_t * world,
    ecs_table_t *new_table,
    ecs_table_t *old_table,
    ecs_data_t *new_data,
    ecs_data_t *old_data)
{
    ecs_assert(old_table != NULL, ECS_INTERNAL_ERROR, NULL);
    bool move_data = false;
    
    /* If there is nothing to merge to, just clear the old table */
    if (!new_table) {
        ecs_table_clear_data(world, old_table, old_data);
        return NULL;
    }

    /* If there is no data to merge, drop out */
    if (!old_data) {
        return NULL;
    }

    if (!new_data) {
        new_data = ecs_table_get_or_create_data(new_table);
        if (new_table == old_table) {
            move_data = true;
        }
    }

    ecs_entity_t *old_entities = ecs_vector_first(old_data->entities, ecs_entity_t);

    int32_t old_count = ecs_vector_count(old_data->entities);
    int32_t new_count = ecs_vector_count(new_data->entities);

    ecs_record_t **old_records = ecs_vector_first(
        old_data->record_ptrs, ecs_record_t*);

    /* First, update entity index so old entities point to new type */
    int32_t i;
    for(i = 0; i < old_count; i ++) {
        ecs_record_t *record;
        if (new_table != old_table) {
            record = old_records[i];
            ecs_assert(record != NULL, ECS_INTERNAL_ERROR, NULL);
        } else {
            record = ecs_eis_get_or_create(world, old_entities[i]);
        }

        bool is_monitored = record->row < 0;
        record->row = ecs_row_to_record(new_count + i, is_monitored);
        record->table = new_table;
    }

    /* Merge table columns */
    if (move_data) {
        *new_data = *old_data;
    } else {
        merge_table_data(world, new_table, old_table, old_count, new_count, 
            old_data, new_data);
    }

    new_table->alloc_count ++;

    if (!new_count && old_count) {
        ecs_table_activate(world, new_table, NULL, true);
    }

    return new_data;
}